

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

void Logger::setFlags(ErrorType type)

{
  bool *pbVar1;
  
  if (type == FatalError) {
    error = true;
    pbVar1 = &fatalError;
  }
  else {
    pbVar1 = &error;
    if ((type != Error) && ((type != Warning || (!errorOnWarning)))) {
      return;
    }
  }
  *pbVar1 = true;
  return;
}

Assistant:

void Logger::setFlags(ErrorType type)
{
	switch (type)
	{
	case Warning:
		if (errorOnWarning)
			error = true;
		break;
	case Error:
		error = true;
		break;
	case FatalError:
		error = true;
		fatalError = true;
		break;
	case Notice:
		break;
	}
}